

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
          (TPZNodeRep<3,_pztopology::TPZLine> *this,void **vtt,TPZVec<long> *nodeindexes)

{
  int iVar1;
  long lVar2;
  
  (this->super_TPZLine).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZLine).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZLine).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  iVar1 = 3;
  if (nodeindexes->fNElements < 3) {
    iVar1 = (int)nodeindexes->fNElements;
  }
  lVar2 = (long)iVar1;
  memcpy(this->fNodeIndexes,nodeindexes->fStore,lVar2 * 8);
  for (; lVar2 < 3; lVar2 = lVar2 + 1) {
    this->fNodeIndexes[lVar2] = -1;
  }
  return;
}

Assistant:

TPZNodeRep(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZNodeRep::ClassId)
        {
            int nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifdef PZDEBUG
            if(nn<N)
            {
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
        }